

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

int kj::anon_unknown_0::base64_decode_block
              (char *code_in,int length_in,char *plaintext_out,base64_decodestate *state_in)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  bool local_5b;
  bool local_5a;
  bool local_59;
  bool local_58;
  bool local_57;
  bool local_56;
  bool local_55;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  byte *pbStack_40;
  char fragment;
  char *plainchar;
  char *codechar;
  base64_decodestate *state_in_local;
  char *plaintext_out_local;
  int length_in_local;
  char *code_in_local;
  
  if (state_in->step != step_a) {
    *plaintext_out = state_in->plainchar;
  }
  iVar1 = (int)plaintext_out;
  pbStack_40 = (byte *)plaintext_out;
  plainchar = code_in;
  switch(state_in->step) {
  case step_a:
    break;
  case step_b:
    goto switchD_005e4015_caseD_1;
  case step_c:
    goto switchD_005e4015_caseD_2;
  case step_d:
    goto switchD_005e4015_caseD_3;
  default:
    return 0;
  }
switchD_005e4015_caseD_0:
  do {
    if (plainchar == code_in + length_in) {
      state_in->step = step_a;
      state_in->plainchar = '\0';
      return (int)pbStack_40 - iVar1;
    }
    pcVar6 = plainchar + 1;
    iVar4 = base64_decode_value(*plainchar);
    cVar2 = (char)iVar4;
    local_51 = (state_in->hadErrors & 1U) != 0 || cVar2 < -1;
    state_in->hadErrors = local_51;
    plainchar = pcVar6;
  } while (cVar2 < '\0');
  *pbStack_40 = cVar2 << 2;
switchD_005e4015_caseD_1:
  do {
    if (plainchar == code_in + length_in) {
      state_in->step = step_b;
      state_in->plainchar = *pbStack_40;
      state_in->hadErrors = true;
      return (int)pbStack_40 - iVar1;
    }
    pcVar6 = plainchar + 1;
    iVar4 = base64_decode_value(*plainchar);
    bVar3 = (byte)iVar4;
    local_52 = (state_in->hadErrors & 1U) != 0 || (char)bVar3 < -1;
    state_in->hadErrors = local_52;
    plainchar = pcVar6;
  } while ((char)bVar3 < '\0');
  *pbStack_40 = *pbStack_40 | (char)(bVar3 & 0x30) >> 4;
  pbStack_40[1] = bVar3 << 4;
  pbStack_40 = pbStack_40 + 1;
switchD_005e4015_caseD_2:
  do {
    if (plainchar == code_in + length_in) {
      state_in->step = step_c;
      state_in->plainchar = *pbStack_40;
      local_53 = true;
      if ((state_in->hadErrors & 1U) == 0) {
        local_53 = state_in->nPaddingBytesSeen == 1;
      }
      state_in->hadErrors = local_53;
      return (int)pbStack_40 - iVar1;
    }
    pcVar6 = plainchar + 1;
    iVar4 = base64_decode_value(*plainchar);
    bVar3 = (byte)iVar4;
    local_54 = true;
    if ((state_in->hadErrors & 1U) == 0) {
      local_55 = true;
      if (-3 < (char)bVar3) {
        local_56 = false;
        if (bVar3 == 0xfe) {
          uVar5 = state_in->nPaddingBytesSeen + 1;
          state_in->nPaddingBytesSeen = uVar5;
          local_56 = 2 < uVar5;
        }
        local_55 = local_56;
      }
      local_54 = local_55;
    }
    state_in->hadErrors = local_54;
    plainchar = pcVar6;
  } while ((char)bVar3 < '\0');
  local_57 = true;
  if ((state_in->hadErrors & 1U) == 0) {
    local_57 = state_in->nPaddingBytesSeen != 0;
  }
  state_in->hadErrors = local_57;
  *pbStack_40 = *pbStack_40 | (char)(bVar3 & 0x3c) >> 2;
  pbStack_40[1] = bVar3 << 6;
  pbStack_40 = pbStack_40 + 1;
switchD_005e4015_caseD_3:
  do {
    if (plainchar == code_in + length_in) {
      state_in->step = step_d;
      state_in->plainchar = *pbStack_40;
      return (int)pbStack_40 - iVar1;
    }
    pcVar6 = plainchar + 1;
    iVar4 = base64_decode_value(*plainchar);
    bVar3 = (byte)iVar4;
    local_58 = true;
    if ((state_in->hadErrors & 1U) == 0) {
      local_59 = true;
      if (-3 < (char)bVar3) {
        local_5a = false;
        if (bVar3 == 0xfe) {
          uVar5 = state_in->nPaddingBytesSeen + 1;
          state_in->nPaddingBytesSeen = uVar5;
          local_5a = 1 < uVar5;
        }
        local_59 = local_5a;
      }
      local_58 = local_59;
    }
    state_in->hadErrors = local_58;
    plainchar = pcVar6;
  } while ((char)bVar3 < '\0');
  local_5b = true;
  if ((state_in->hadErrors & 1U) == 0) {
    local_5b = state_in->nPaddingBytesSeen != 0;
  }
  state_in->hadErrors = local_5b;
  *pbStack_40 = *pbStack_40 | bVar3 & 0x3f;
  pbStack_40 = pbStack_40 + 1;
  goto switchD_005e4015_caseD_0;
}

Assistant:

int base64_decode_block(const char* code_in, const int length_in,
                        char* plaintext_out, base64_decodestate* state_in) {
  const char* codechar = code_in;
  char* plainchar = plaintext_out;
  signed char fragment;

  if (state_in->step != step_a) {
    *plainchar = state_in->plainchar;
  }

#define ERROR_IF(predicate) state_in->hadErrors = state_in->hadErrors || (predicate)

  switch (state_in->step)
  {
    while (1)
    {
  case step_a:
      do {
        if (codechar == code_in+length_in) {
          state_in->step = step_a;
          state_in->plainchar = '\0';
          return plainchar - plaintext_out;
        }
        fragment = (signed char)base64_decode_value(*codechar++);
        // It is an error to see invalid or padding bytes in step A.
        ERROR_IF(fragment < -1);
      } while (fragment < 0);
      *plainchar    = (fragment & 0x03f) << 2;
      // fallthrough
  case step_b:
      do {
        if (codechar == code_in+length_in) {
          state_in->step = step_b;
          state_in->plainchar = *plainchar;
          // It is always an error to suspend from step B, because we don't have enough bits yet.
          // TODO(someday): This actually breaks the streaming use case, if base64_decode_block() is
          //   to be called multiple times. We'll fix it if we ever care to support streaming.
          state_in->hadErrors = true;
          return plainchar - plaintext_out;
        }
        fragment = (signed char)base64_decode_value(*codechar++);
        // It is an error to see invalid or padding bytes in step B.
        ERROR_IF(fragment < -1);
      } while (fragment < 0);
      *plainchar++ |= (fragment & 0x030) >> 4;
      *plainchar    = (fragment & 0x00f) << 4;
      // fallthrough
  case step_c:
      do {
        if (codechar == code_in+length_in) {
          state_in->step = step_c;
          state_in->plainchar = *plainchar;
          // It is an error to complete from step C if we have seen incomplete padding.
          // TODO(someday): This actually breaks the streaming use case, if base64_decode_block() is
          //   to be called multiple times. We'll fix it if we ever care to support streaming.
          ERROR_IF(state_in->nPaddingBytesSeen == 1);
          return plainchar - plaintext_out;
        }
        fragment = (signed char)base64_decode_value(*codechar++);
        // It is an error to see invalid bytes or more than two padding bytes in step C.
        ERROR_IF(fragment < -2 || (fragment == -2 && ++state_in->nPaddingBytesSeen > 2));
      } while (fragment < 0);
      // It is an error to continue from step C after having seen any padding.
      ERROR_IF(state_in->nPaddingBytesSeen > 0);
      *plainchar++ |= (fragment & 0x03c) >> 2;
      *plainchar    = (fragment & 0x003) << 6;
      // fallthrough
  case step_d:
      do {
        if (codechar == code_in+length_in) {
          state_in->step = step_d;
          state_in->plainchar = *plainchar;
          return plainchar - plaintext_out;
        }
        fragment = (signed char)base64_decode_value(*codechar++);
        // It is an error to see invalid bytes or more than one padding byte in step D.
        ERROR_IF(fragment < -2 || (fragment == -2 && ++state_in->nPaddingBytesSeen > 1));
      } while (fragment < 0);
      // It is an error to continue from step D after having seen padding bytes.
      ERROR_IF(state_in->nPaddingBytesSeen > 0);
      *plainchar++   |= (fragment & 0x03f);
    }
  }

#undef ERROR_IF

  /* control should not reach here */
  return plainchar - plaintext_out;
}